

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
header_inclusion_txt_actions::heading
          (header_inclusion_txt_actions *this,string *header,string *module)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Inclusion report for <");
  poVar1 = std::operator<<(poVar1,(string *)header);
  poVar1 = std::operator<<(poVar1,"> (in module ");
  poVar1 = std::operator<<(poVar1,(string *)module);
  std::operator<<(poVar1,"):\n\n");
  return;
}

Assistant:

void heading( std::string const & header, std::string const & module )
    {
        std::cout << "Inclusion report for <" << header << "> (in module " << module << "):\n\n";
    }